

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

bool __thiscall ON_LineCurve::IsInPlane(ON_LineCurve *this,ON_Plane *plane,double tolerance)

{
  double dVar1;
  ON_3dPoint local_30;
  
  ON_Curve::PointAtStart(&local_30,&this->super_ON_Curve);
  dVar1 = ON_Plane::DistanceTo(plane,&local_30);
  if (ABS(dVar1) <= tolerance) {
    ON_Curve::PointAtEnd(&local_30,&this->super_ON_Curve);
    dVar1 = ON_Plane::DistanceTo(plane,&local_30);
    if (ABS(dVar1) <= tolerance) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
ON_LineCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  double d = fabs( plane.DistanceTo( PointAtStart() ));
  if ( d <= tolerance ) {
    d = fabs( plane.DistanceTo( PointAtEnd() ));
    if ( d <= tolerance )
      rc = true;
  }
  return rc;
}